

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMStateSet.hpp
# Opt level: O1

CMStateSet * __thiscall xercesc_4_0::CMStateSet::operator=(CMStateSet *this,CMStateSet *srcSet)

{
  XMLSize_t index;
  CMDynamicBuffer *pCVar1;
  long lVar2;
  RuntimeException *this_00;
  XMLSize_t index_00;
  
  if (this != srcSet) {
    pCVar1 = this->fDynamicBuffer;
    if (this->fBitCount != srcSet->fBitCount) {
      this_00 = (RuntimeException *)__cxa_allocate_exception(0x30);
      if (pCVar1 == (CMDynamicBuffer *)0x0) {
        RuntimeException::RuntimeException
                  (this_00,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/common/CMStateSet.hpp"
                   ,0x120,Bitset_NotEqualSize,(MemoryManager *)0x0);
      }
      else {
        RuntimeException::RuntimeException
                  (this_00,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/common/CMStateSet.hpp"
                   ,0x11e,Bitset_NotEqualSize,this->fDynamicBuffer->fMemoryManager);
      }
      __cxa_throw(this_00,&RuntimeException::typeinfo,XMLException::~XMLException);
    }
    if (pCVar1 == (CMDynamicBuffer *)0x0) {
      lVar2 = 0;
      do {
        this->fBits[lVar2] = srcSet->fBits[lVar2];
        lVar2 = lVar2 + 1;
      } while (lVar2 != 4);
    }
    else {
      pCVar1 = this->fDynamicBuffer;
      if (pCVar1->fArraySize != 0) {
        index_00 = 0;
        do {
          if (srcSet->fDynamicBuffer->fBitArray[index_00] == (XMLInt32 *)0x0) {
            if (pCVar1->fBitArray[index_00] != (XMLInt32 *)0x0) {
              deallocateChunk(this,index_00);
            }
          }
          else {
            if (pCVar1->fBitArray[index_00] == (XMLInt32 *)0x0) {
              allocateChunk(this,index_00);
            }
            memcpy(this->fDynamicBuffer->fBitArray[index_00],
                   srcSet->fDynamicBuffer->fBitArray[index_00],0x80);
          }
          index_00 = index_00 + 1;
          pCVar1 = this->fDynamicBuffer;
        } while (index_00 < pCVar1->fArraySize);
      }
    }
  }
  return this;
}

Assistant:

CMStateSet& operator=(const CMStateSet& srcSet)
    {
        if (this == &srcSet)
            return *this;

        // They have to be the same size
        if (fBitCount != srcSet.fBitCount)
        {
            if(fDynamicBuffer)
                ThrowXMLwithMemMgr(RuntimeException, XMLExcepts::Bitset_NotEqualSize, fDynamicBuffer->fMemoryManager);
            else
                ThrowXML(RuntimeException, XMLExcepts::Bitset_NotEqualSize);
        }

        if(fDynamicBuffer==0)
        {
            for (XMLSize_t index = 0; index < CMSTATE_CACHED_INT32_SIZE; index++)
                fBits[index] = srcSet.fBits[index];
        }
        else
        {
            for (XMLSize_t index = 0; index < fDynamicBuffer->fArraySize; index++)
                if(srcSet.fDynamicBuffer->fBitArray[index]==NULL)
                {
                    // delete this subentry
                    if(fDynamicBuffer->fBitArray[index]!=NULL)
                        deallocateChunk(index);
                }
                else
                {
                    // if we haven't allocated the subvector yet, allocate it and copy
                    if(fDynamicBuffer->fBitArray[index]==NULL)
                        allocateChunk(index);
                    memcpy((void *) fDynamicBuffer->fBitArray[index],
                           (const void *) srcSet.fDynamicBuffer->fBitArray[index],
                           CMSTATE_BITFIELD_INT32_SIZE * sizeof(XMLInt32));
                }
        }
        return *this;
    }